

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

TValue * cpfinalize(lua_State *L,lua_CFunction dummy,void *ud)

{
  lj_gc_finalize_cdata(L);
  lj_gc_finalize_udata(L);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpfinalize(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(dummy);
  UNUSED(ud);
  lj_gc_finalize_cdata(L);
  lj_gc_finalize_udata(L);
  /* Frame pop omitted. */
  return NULL;
}